

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

ion_bpp_err_t b_get(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_buffer_t *piVar1;
  int iVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_address_t adr;
  ion_bpp_key_t *mkey;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *local_40;
  ion_bpp_buffer_t *local_38;
  
  local_38 = (ion_bpp_buffer_t *)((long)handle + 0x20);
  if ((**(byte **)((long)handle + 0x38) & 1) == 0) {
    do {
      iVar2 = search(handle,local_38,key,0,&local_40,MODE_MATCH);
      if (iVar2 < 0) {
        adr = *(ion_bpp_address_t *)(local_40 + -8);
      }
      else {
        adr = *(ion_bpp_address_t *)(local_40 + (long)*(int *)((long)handle + 8) + 8);
      }
      iVar3 = readDisk(handle,adr,&local_38);
      if (iVar3 != bErrOk) {
        return iVar3;
      }
    } while ((undefined1  [40])((undefined1  [40])*local_38->p & (undefined1  [40])0x1) ==
             (undefined1  [40])0x0);
  }
  piVar1 = local_38;
  iVar2 = search(handle,local_38,key,0,&local_40,MODE_FIRST);
  if (iVar2 == 0) {
    *rec = *(ion_bpp_external_address_t *)(local_40 + *(int *)((long)handle + 8));
    *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piVar1;
    *(ion_bpp_key_t **)((long)handle + 0xb0) = local_40;
  }
  return (uint)(iVar2 != 0);
}

Assistant:

ion_bpp_err_t
b_get(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_key_t		*mkey;			/* matched key */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	/* find key, and return address */
	while (1) {
		if (leaf(buf)) {
			if (search(handle, buf, key, 0, &mkey, MODE_FIRST) == 0) {
				*rec		= rec(mkey);
				h->curBuf	= buf;
				h->curKey	= mkey;
				return bErrOk;
			}
			else {
				return bErrKeyNotFound;
			}
		}
		else {
			if (search(handle, buf, key, 0, &mkey, MODE_MATCH) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &buf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &buf)) != 0) {
					return rc;
				}
			}
		}
	}
}